

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_overflow_strings_to_disk.cpp
# Opt level: O2

string * __thiscall
duckdb::UncompressedStringSegmentState::GetSegmentInfo_abi_cxx11_
          (string *__return_storage_ptr__,UncompressedStringSegmentState *this)

{
  pointer plVar1;
  pointer plVar2;
  const_reference pvVar3;
  ulong __n;
  allocator local_b9;
  string *local_b8;
  string result;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  plVar1 = (this->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  plVar2 = (this->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  local_b8 = __return_storage_ptr__;
  if (plVar1 == plVar2) {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,anon_var_dwarf_4b0ffdd + 9,(allocator *)&local_90);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_70,", ",&local_b9);
    result._M_dataplus._M_p = (pointer)&result.field_2;
    result._M_string_length = 0;
    result.field_2._M_local_buf[0] = '\0';
    pvVar3 = vector<long,_true>::get<true>(&this->on_disk_blocks,0);
    ::std::__cxx11::to_string(&local_90,*pvVar3);
    ::std::__cxx11::string::append((string *)&result);
    ::std::__cxx11::string::~string((string *)&local_90);
    for (__n = 1; __n < (ulong)((long)plVar2 - (long)plVar1 >> 3); __n = __n + 1) {
      pvVar3 = vector<long,_true>::get<true>(&this->on_disk_blocks,__n);
      ::std::__cxx11::to_string(&local_50,*pvVar3);
      ::std::operator+(&local_90,&local_70,&local_50);
      ::std::__cxx11::string::append((string *)&result);
      ::std::__cxx11::string::~string((string *)&local_90);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::operator+(local_b8,"Overflow String Block Ids: ",&result);
    ::std::__cxx11::string::~string((string *)&result);
  }
  return local_b8;
}

Assistant:

string UncompressedStringSegmentState::GetSegmentInfo() const {
	if (on_disk_blocks.empty()) {
		return "";
	}
	string result = StringUtil::Join(on_disk_blocks, on_disk_blocks.size(), ", ",
	                                 [&](block_id_t block) { return to_string(block); });
	return "Overflow String Block Ids: " + result;
}